

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

SmallVectorBase<slang::IntervalMapDetails::Path::Entry> * __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator=
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,
          SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *rhs)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pEVar3;
  size_type sVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pEVar7;
  undefined8 uVar8;
  long lVar9;
  
  if (this != rhs) {
    pEVar3 = rhs->data_;
    if (pEVar3 == (pointer)rhs->firstElement) {
      uVar5 = this->len;
      uVar6 = rhs->len;
      if (uVar5 < uVar6) {
        if (this->cap < uVar6) {
          this->len = 0;
          reserve(this,rhs->len);
        }
        else if (uVar5 != 0) {
          memmove(this->data_,pEVar3,uVar5 << 4);
        }
        sVar4 = rhs->len;
        if (this->len != sVar4) {
          pEVar3 = rhs->data_;
          pEVar7 = this->data_;
          lVar9 = this->len << 4;
          do {
            puVar1 = (undefined8 *)((long)&pEVar3->node + lVar9);
            uVar8 = puVar1[1];
            puVar2 = (undefined8 *)((long)&pEVar7->node + lVar9);
            *puVar2 = *puVar1;
            puVar2[1] = uVar8;
            lVar9 = lVar9 + 0x10;
          } while (sVar4 << 4 != lVar9);
        }
      }
      else if (uVar6 != 0) {
        memmove(this->data_,pEVar3,uVar6 << 4);
      }
      this->len = rhs->len;
      rhs->len = 0;
    }
    else {
      if (this->data_ != (pointer)this->firstElement) {
        operator_delete(this->data_);
      }
      pEVar3 = rhs->data_;
      rhs->data_ = (pointer)0x0;
      this->data_ = pEVar3;
      sVar4 = rhs->len;
      rhs->len = 0;
      this->len = sVar4;
      sVar4 = rhs->cap;
      rhs->cap = 0;
      this->cap = sVar4;
    }
  }
  return this;
}

Assistant:

SmallVectorBase<T>& SmallVectorBase<T>::operator=(SmallVectorBase<T>&& rhs) {
    if (this == &rhs)
        return *this;

    // If the rhs isn't small, clear this vector and then steal its buffer.
    if (!rhs.isSmall()) {
        cleanup();
        this->data_ = std::exchange(rhs.data_, nullptr);
        this->len = std::exchange(rhs.len, 0);
        this->cap = std::exchange(rhs.cap, 0);
        return *this;
    }

    // If we already have sufficient space assign the common elements,
    // then destroy any excess.
    if (len >= rhs.size()) {
        iterator newEnd;
        if (rhs.size())
            newEnd = std::ranges::move(rhs, begin()).out;
        else
            newEnd = begin();

        std::ranges::destroy(newEnd, end());
        len = rhs.size();
        rhs.clear();
        return *this;
    }

    if (capacity() < rhs.size()) {
        // If we have to grow to have enough elements, destroy the current elements.
        // This allows us to avoid copying them during the grow.
        clear();
        reserve(rhs.size());
    }
    else if (len) {
        // Otherwise, use assignment for the already-constructed elements.
        std::ranges::move(rhs.begin(), rhs.begin() + len, begin());
    }

    // Move construct the new elements in place.
    std::uninitialized_move(rhs.begin() + len, rhs.end(), begin() + len);
    len = rhs.size();
    rhs.clear();
    return *this;
}